

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interfaces.cpp
# Opt level: O0

unique_ptr<interfaces::Handler,_std::default_delete<interfaces::Handler>_>
interfaces::MakeSignalHandler(connection *connection)

{
  long lVar1;
  tuple<interfaces::Handler_*,_std::default_delete<interfaces::Handler>_> in_RDI;
  long in_FS_OFFSET;
  __uniq_ptr_impl<interfaces::Handler,_std::default_delete<interfaces::Handler>_> __u;
  unique_ptr<common::(anonymous_namespace)::SignalHandler,_std::default_delete<common::(anonymous_namespace)::SignalHandler>_>
  *this;
  unique_ptr<common::(anonymous_namespace)::SignalHandler,_std::default_delete<common::(anonymous_namespace)::SignalHandler>_>
  in_stack_fffffffffffffff0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this = (unique_ptr<common::(anonymous_namespace)::SignalHandler,_std::default_delete<common::(anonymous_namespace)::SignalHandler>_>
          *)&stack0xfffffffffffffff0;
  __u._M_t.super__Tuple_impl<0UL,_interfaces::Handler_*,_std::default_delete<interfaces::Handler>_>.
  super__Head_base<0UL,_interfaces::Handler_*,_false>._M_head_impl =
       (tuple<interfaces::Handler_*,_std::default_delete<interfaces::Handler>_>)
       (tuple<interfaces::Handler_*,_std::default_delete<interfaces::Handler>_>)
       in_RDI.
       super__Tuple_impl<0UL,_interfaces::Handler_*,_std::default_delete<interfaces::Handler>_>.
       super__Head_base<0UL,_interfaces::Handler_*,_false>._M_head_impl;
  std::make_unique<common::(anonymous_namespace)::SignalHandler,boost::signals2::connection>
            ((connection *)
             in_stack_fffffffffffffff0._M_t.
             super___uniq_ptr_impl<common::(anonymous_namespace)::SignalHandler,_std::default_delete<common::(anonymous_namespace)::SignalHandler>_>
             ._M_t.
             super__Tuple_impl<0UL,_common::(anonymous_namespace)::SignalHandler_*,_std::default_delete<common::(anonymous_namespace)::SignalHandler>_>
             .super__Head_base<0UL,_common::(anonymous_namespace)::SignalHandler_*,_false>.
             _M_head_impl);
  std::unique_ptr<interfaces::Handler,std::default_delete<interfaces::Handler>>::
  unique_ptr<common::(anonymous_namespace)::SignalHandler,std::default_delete<common::(anonymous_namespace)::SignalHandler>,void>
            ((unique_ptr<interfaces::Handler,_std::default_delete<interfaces::Handler>_> *)this,
             (unique_ptr<common::(anonymous_namespace)::SignalHandler,_std::default_delete<common::(anonymous_namespace)::SignalHandler>_>
              *)__u._M_t.
                super__Tuple_impl<0UL,_interfaces::Handler_*,_std::default_delete<interfaces::Handler>_>
                .super__Head_base<0UL,_interfaces::Handler_*,_false>._M_head_impl);
  std::
  unique_ptr<common::(anonymous_namespace)::SignalHandler,_std::default_delete<common::(anonymous_namespace)::SignalHandler>_>
  ::~unique_ptr(this);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (__uniq_ptr_data<interfaces::Handler,_std::default_delete<interfaces::Handler>,_true,_true>
            )(__uniq_ptr_data<interfaces::Handler,_std::default_delete<interfaces::Handler>,_true,_true>
              )in_RDI.
               super__Tuple_impl<0UL,_interfaces::Handler_*,_std::default_delete<interfaces::Handler>_>
               .super__Head_base<0UL,_interfaces::Handler_*,_false>._M_head_impl;
  }
  __stack_chk_fail();
}

Assistant:

std::unique_ptr<Handler> MakeSignalHandler(boost::signals2::connection connection)
{
    return std::make_unique<common::SignalHandler>(std::move(connection));
}